

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  Int32 IVar2;
  Int32 result;
  string env_var;
  Int32 local_64;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  string local_58;
  char *local_38 [4];
  
  FlagToEnvVar_abi_cxx11_((char *)in_stack_ffffffffffffffa0.ptr_);
  str = getenv(local_38[0]);
  IVar2 = default_value;
  if (str != (char *)0x0) {
    local_64 = default_value;
    Message::Message((Message *)&local_58);
    std::operator<<((ostream *)(local_58._M_dataplus._M_p + 0x10),"Environment variable ");
    std::operator<<((ostream *)(local_58._M_dataplus._M_p + 0x10),(string *)local_38);
    bVar1 = ParseInt32((Message *)&local_58,str,&local_64);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
    IVar2 = local_64;
    if (!bVar1) {
      Message::Message((Message *)&stack0xffffffffffffffa0);
      std::ostream::operator<<(in_stack_ffffffffffffffa0.ptr_ + 0x10,default_value);
      StringStreamToString(&local_58,in_stack_ffffffffffffffa0.ptr_);
      printf("The default value %s is used.\n",local_58._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_58);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffa0);
      fflush(_stdout);
      IVar2 = default_value;
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return IVar2;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}